

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O2

void __thiscall
duckdb::CardinalityEstimator::UpdateTotalDomains
          (CardinalityEstimator *this,optional_ptr<duckdb::JoinRelationSet,_true> set,
          RelationStats *stats)

{
  idx_t iVar1;
  pointer pRVar2;
  JoinRelationSet *pJVar3;
  iterator iVar4;
  reference pvVar5;
  ulong uVar6;
  ulong uVar7;
  pointer __ht;
  ulong __n;
  ColumnBinding key;
  column_binding_set_t i_set;
  key_type local_80;
  optional_ptr<duckdb::JoinRelationSet,_true> local_70;
  _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_70.ptr = set.ptr;
  pJVar3 = optional_ptr<duckdb::JoinRelationSet,_true>::operator->(&local_70);
  iVar1 = *(unsigned_long *)
           (pJVar3->relations).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
  __n = 0;
  do {
    if ((ulong)((long)(stats->column_distinct_count).
                      super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                      super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(stats->column_distinct_count).
                      super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                      super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= __n) {
      return;
    }
    pRVar2 = (this->relations_to_tdoms).
             super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
             super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_80.table_index = iVar1;
    local_80.column_index = __n;
    for (__ht = (this->relations_to_tdoms).
                super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
                super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                ._M_impl.super__Vector_impl_data._M_start; __ht != pRVar2; __ht = __ht + 1) {
      ::std::
      _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_Hashtable(&local_68,
                   (_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)__ht);
      iVar4 = ::std::
              _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&local_68,&local_80);
      if (iVar4.super__Node_iterator_base<duckdb::ColumnBinding,_true>._M_cur != (__node_type *)0x0)
      {
        pvVar5 = ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::at
                           ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *
                            )stats,__n);
        uVar7 = pvVar5->distinct_count;
        if ((pvVar5->from_hll & 1U) == 0) {
          uVar6 = __ht->tdom_no_hll;
          if (uVar7 < __ht->tdom_no_hll) {
            uVar6 = uVar7;
          }
          __ht->tdom_no_hll = uVar6;
        }
        else {
          if (__ht->has_tdom_hll == true) {
            if (uVar7 < __ht->tdom_hll) {
              uVar7 = __ht->tdom_hll;
            }
          }
          else {
            __ht->has_tdom_hll = true;
          }
          __ht->tdom_hll = uVar7;
        }
        ::std::
        _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_68);
        break;
      }
      ::std::
      _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

void CardinalityEstimator::UpdateTotalDomains(optional_ptr<JoinRelationSet> set, RelationStats &stats) {
	D_ASSERT(set->count == 1);
	auto relation_id = set->relations[0];
	//! Initialize the distinct count for all columns used in joins with the current relation.
	//	D_ASSERT(stats.column_distinct_count.size() >= 1);

	for (idx_t i = 0; i < stats.column_distinct_count.size(); i++) {
		//! for every column used in a filter in the relation, get the distinct count via HLL, or assume it to be
		//! the cardinality
		// Update the relation_to_tdom set with the estimated distinct count (or tdom) calculated above
		auto key = ColumnBinding(relation_id, i);
		for (auto &relation_to_tdom : relations_to_tdoms) {
			column_binding_set_t i_set = relation_to_tdom.equivalent_relations;
			if (i_set.find(key) == i_set.end()) {
				continue;
			}
			auto distinct_count = stats.column_distinct_count.at(i);
			if (distinct_count.from_hll && relation_to_tdom.has_tdom_hll) {
				relation_to_tdom.tdom_hll = MaxValue(relation_to_tdom.tdom_hll, distinct_count.distinct_count);
			} else if (distinct_count.from_hll && !relation_to_tdom.has_tdom_hll) {
				relation_to_tdom.has_tdom_hll = true;
				relation_to_tdom.tdom_hll = distinct_count.distinct_count;
			} else {
				relation_to_tdom.tdom_no_hll = MinValue(distinct_count.distinct_count, relation_to_tdom.tdom_no_hll);
			}
			break;
		}
	}
}